

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

void JFSON::dump(array *values,string *out)

{
  bool bVar1;
  bool bVar2;
  reference this;
  Json *value;
  const_iterator __end1;
  const_iterator __begin1;
  array *__range1;
  bool first;
  string *out_local;
  array *values_local;
  
  bVar1 = true;
  std::__cxx11::string::operator+=((string *)out,"[");
  __end1 = std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::begin(values);
  value = (Json *)std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>::end(values);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_JFSON::Json_*,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>
                                *)&value);
    if (!bVar2) break;
    this = __gnu_cxx::
           __normal_iterator<const_JFSON::Json_*,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>
           ::operator*(&__end1);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)out,", ");
    }
    Json::dump(this,out);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<const_JFSON::Json_*,_std::vector<JFSON::Json,_std::allocator<JFSON::Json>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)out,"]");
  return;
}

Assistant:

static void dump(const Json::array &values, std::string &out) {
    bool first = true;
    out += "[";
    for (const auto &value : values) {
        if (!first) {
            out += ", ";
        }
        value.dump(out);
        first = false;
    }
    out += "]";
}